

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::~IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  ~IfcCShapeProfileDef(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}